

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

int tidySaveFile(TidyDoc tdoc,ctmbstr filnam)

{
  int iVar1;
  FILE *__stream;
  StreamOut *out;
  
  if (((tdoc[0xd0b]._opaque != 0) && (tdoc[0xde]._opaque != 0)) && (tdoc[0x58]._opaque == 0)) {
    iVar1 = tidyDocStatus((TidyDocImpl *)tdoc);
    return iVar1;
  }
  __stream = fopen(filnam,"wb");
  if (__stream == (FILE *)0x0) {
    prvTidyReportFileError((TidyDocImpl *)tdoc,filnam,0x23d);
    iVar1 = -2;
  }
  else {
    out = prvTidyFileOutput((TidyDocImpl *)tdoc,(FILE *)__stream,tdoc[0x94]._opaque,
                            tdoc[0x8e]._opaque);
    iVar1 = tidyDocSaveStream((TidyDocImpl *)tdoc,out);
    fclose(__stream);
    (**(code **)(**(long **)(tdoc + 0xd18) + 0x10))(*(long **)(tdoc + 0xd18),out);
    if (*(long *)(tdoc + 0xd1e) != 0) {
      utime(filnam,(utimbuf *)(tdoc + 0xd1e));
      ((utimbuf *)(tdoc + 0xd1e))->actime = 0;
      *(undefined8 *)(tdoc + 0xd20) = 0;
    }
  }
  return iVar1;
}

Assistant:

int TIDY_CALL        tidySaveFile( TidyDoc tdoc, ctmbstr filnam )
{
    TidyDocImpl* doc = tidyDocToImpl( tdoc );
    return tidyDocSaveFile( doc, filnam );
}